

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::ShowMetricsWindow::Funcs::NodeTabBar(ImGuiTabBar *tab_bar)

{
  uint uVar1;
  ImDrawList *pIVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  size_t buf_size;
  char *pcVar6;
  ImVec4 *col;
  ImGuiTabItem *tab_00;
  char *pcVar7;
  char *local_1c8;
  char local_1b1;
  char *local_1a0;
  ImGuiTabItem *tab_1;
  int tab_n_1;
  ImVec2 local_160;
  ImVec2 local_158;
  ImVec2 local_150;
  ImDrawList *local_148;
  ImDrawList *draw_list;
  ImGuiTabItem *pIStack_138;
  bool open;
  ImGuiTabItem *tab;
  int tab_n;
  bool is_active;
  char *buf_end;
  char *p;
  char buf [256];
  ImGuiTabBar *tab_bar_local;
  
  buf_end = (char *)&p;
  _tab_n = buf + 0xf8;
  iVar5 = tab_bar->PrevFrameVisible;
  iVar4 = GetFrameCount();
  tab._7_1_ = iVar4 + -2 <= iVar5;
  pcVar7 = " *Inactive*";
  if ((bool)tab._7_1_) {
    pcVar7 = "";
  }
  iVar5 = ImFormatString(buf_end,(long)_tab_n - (long)buf_end,"Tab Bar 0x%08X (%d tabs)%s",
                         (ulong)tab_bar->ID,(ulong)(uint)(tab_bar->Tabs).Size,pcVar7);
  buf_end = buf_end + iVar5;
  iVar5 = ImFormatString(buf_end,(long)_tab_n - (long)buf_end,"  { ");
  buf_end = buf_end + iVar5;
  for (tab._0_4_ = 0; iVar5 = (int)tab, iVar4 = ImMin<int>((tab_bar->Tabs).Size,3), iVar5 < iVar4;
      tab._0_4_ = (int)tab + 1) {
    pIStack_138 = ImVector<ImGuiTabItem>::operator[](&tab_bar->Tabs,(int)tab);
    pcVar7 = buf_end;
    buf_size = (long)_tab_n - (long)buf_end;
    pcVar6 = "";
    if (0 < (int)tab) {
      pcVar6 = ", ";
    }
    if ((pIStack_138->Window == (ImGuiWindow *)0x0) && (pIStack_138->NameOffset == -1)) {
      local_1a0 = "???";
    }
    else {
      local_1a0 = ImGuiTabBar::GetTabName(tab_bar,pIStack_138);
    }
    iVar5 = ImFormatString(pcVar7,buf_size,"%s\'%s\'",pcVar6,local_1a0);
    buf_end = buf_end + iVar5;
  }
  pcVar7 = " } ";
  if (3 < (tab_bar->Tabs).Size) {
    pcVar7 = " ... }";
  }
  iVar5 = ImFormatString(buf_end,(long)_tab_n - (long)buf_end,pcVar7);
  buf_end = buf_end + iVar5;
  if ((tab._7_1_ & 1) == 0) {
    col = GetStyleColorVec4(1);
    PushStyleColor(0,col);
  }
  draw_list._7_1_ = TreeNode(tab_bar,"%s",&p);
  if ((tab._7_1_ & 1) == 0) {
    PopStyleColor(1);
  }
  if (((tab._7_1_ & 1) != 0) && (bVar3 = IsItemHovered(0), bVar3)) {
    local_148 = GetForegroundDrawList();
    ImDrawList::AddRect(local_148,&(tab_bar->BarRect).Min,&(tab_bar->BarRect).Max,0xff00ffff,0.0,0xf
                        ,1.0);
    pIVar2 = local_148;
    ImVec2::ImVec2(&local_150,tab_bar->ScrollingRectMinX,(tab_bar->BarRect).Min.y);
    ImVec2::ImVec2(&local_158,tab_bar->ScrollingRectMinX,(tab_bar->BarRect).Max.y);
    ImDrawList::AddLine(pIVar2,&local_150,&local_158,0xff00ff00,1.0);
    pIVar2 = local_148;
    ImVec2::ImVec2(&local_160,tab_bar->ScrollingRectMaxX,(tab_bar->BarRect).Min.y);
    ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffffe98,tab_bar->ScrollingRectMaxX,
                   (tab_bar->BarRect).Max.y);
    ImDrawList::AddLine(pIVar2,&local_160,(ImVec2 *)&stack0xfffffffffffffe98,0xff00ff00,1.0);
  }
  if ((draw_list._7_1_ & 1) != 0) {
    for (tab_1._4_4_ = 0; (int)tab_1._4_4_ < (tab_bar->Tabs).Size; tab_1._4_4_ = tab_1._4_4_ + 1) {
      tab_00 = ImVector<ImGuiTabItem>::operator[](&tab_bar->Tabs,tab_1._4_4_);
      PushID(tab_00);
      bVar3 = SmallButton("<");
      if (bVar3) {
        TabBarQueueReorder(tab_bar,tab_00,-1);
      }
      SameLine(0.0,2.0);
      bVar3 = SmallButton(">");
      if (bVar3) {
        TabBarQueueReorder(tab_bar,tab_00,1);
      }
      SameLine(0.0,-1.0);
      local_1b1 = '*';
      if (tab_00->ID != tab_bar->SelectedTabId) {
        local_1b1 = ' ';
      }
      uVar1 = tab_00->ID;
      if ((tab_00->Window == (ImGuiWindow *)0x0) && (tab_00->NameOffset == -1)) {
        local_1c8 = "???";
      }
      else {
        local_1c8 = ImGuiTabBar::GetTabName(tab_bar,tab_00);
      }
      Text("%02d%c Tab 0x%08X \'%s\' Offset: %.1f, Width: %.1f/%.1f",(double)tab_00->Offset,
           (double)tab_00->Width,(double)tab_00->ContentWidth,(ulong)tab_1._4_4_,
           (ulong)(uint)(int)local_1b1,(ulong)uVar1,local_1c8);
      PopID();
    }
    TreePop();
  }
  return;
}

Assistant:

static void NodeTabBar(ImGuiTabBar* tab_bar)
        {
            // Standalone tab bars (not associated to docking/windows functionality) currently hold no discernible strings.
            char buf[256];
            char* p = buf;
            const char* buf_end = buf + IM_ARRAYSIZE(buf);
            const bool is_active = (tab_bar->PrevFrameVisible >= ImGui::GetFrameCount() - 2);
            p += ImFormatString(p, buf_end - p, "Tab Bar 0x%08X (%d tabs)%s", tab_bar->ID, tab_bar->Tabs.Size, is_active ? "" : " *Inactive*");
            p += ImFormatString(p, buf_end - p, "  { ");
            for (int tab_n = 0; tab_n < ImMin(tab_bar->Tabs.Size, 3); tab_n++)
            {
                ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
                p += ImFormatString(p, buf_end - p, "%s'%s'",
                    tab_n > 0 ? ", " : "", (tab->Window || tab->NameOffset != -1) ? tab_bar->GetTabName(tab) : "???");
            }
            p += ImFormatString(p, buf_end - p, (tab_bar->Tabs.Size > 3) ? " ... }" : " } ");
            if (!is_active) { PushStyleColor(ImGuiCol_Text, GetStyleColorVec4(ImGuiCol_TextDisabled)); }
            bool open = ImGui::TreeNode(tab_bar, "%s", buf);
            if (!is_active) { PopStyleColor(); }
            if (is_active && ImGui::IsItemHovered())
            {
                ImDrawList* draw_list = ImGui::GetForegroundDrawList();
                draw_list->AddRect(tab_bar->BarRect.Min, tab_bar->BarRect.Max, IM_COL32(255, 255, 0, 255));
                draw_list->AddLine(ImVec2(tab_bar->ScrollingRectMinX, tab_bar->BarRect.Min.y), ImVec2(tab_bar->ScrollingRectMinX, tab_bar->BarRect.Max.y), IM_COL32(0, 255, 0, 255));
                draw_list->AddLine(ImVec2(tab_bar->ScrollingRectMaxX, tab_bar->BarRect.Min.y), ImVec2(tab_bar->ScrollingRectMaxX, tab_bar->BarRect.Max.y), IM_COL32(0, 255, 0, 255));
            }
            if (open)
            {
                for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
                {
                    const ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
                    ImGui::PushID(tab);
                    if (ImGui::SmallButton("<")) { TabBarQueueReorder(tab_bar, tab, -1); } ImGui::SameLine(0, 2);
                    if (ImGui::SmallButton(">")) { TabBarQueueReorder(tab_bar, tab, +1); } ImGui::SameLine();
                    ImGui::Text("%02d%c Tab 0x%08X '%s' Offset: %.1f, Width: %.1f/%.1f",
                        tab_n, (tab->ID == tab_bar->SelectedTabId) ? '*' : ' ', tab->ID, (tab->Window || tab->NameOffset != -1) ? tab_bar->GetTabName(tab) : "???", tab->Offset, tab->Width, tab->ContentWidth);
                    ImGui::PopID();
                }
                ImGui::TreePop();
            }
        }